

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall CMU462::HalfedgeMesh::triangulate(HalfedgeMesh *this)

{
  bool bVar1;
  FaceIter f;
  HalfedgeMesh *in_stack_00000178;
  FaceIter in_stack_00000180;
  HalfedgeMesh *in_stack_ffffffffffffffc8;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node = (_List_node_base *)facesBegin(in_stack_ffffffffffffffc8);
  while( true ) {
    local_18._M_node = (_List_node_base *)facesEnd(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    splitPolygon(in_stack_00000178,in_stack_00000180);
    std::_List_iterator<CMU462::Face>::operator++(local_10,0);
  }
  return;
}

Assistant:

void HalfedgeMesh::triangulate() {
  for (FaceIter f = facesBegin(); f != facesEnd(); f++) {
    splitPolygon(f);
  }
}